

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHelper.cc
# Opt level: O3

float OpenMesh::IO::read_float(istream *_in,bool _swap)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  undefined1 uVar4;
  float fVar5;
  undefined7 in_register_00000001;
  undefined7 in_register_00000031;
  undefined1 auStack_18 [4];
  undefined4 local_14;
  u3 fc;
  
  local_14 = (float)((uint7)in_register_00000001 >> 0x18);
  std::istream::read((char *)_in,(long)&local_14);
  fVar5 = local_14;
  if ((int)CONCAT71(in_register_00000031,_swap) != 0) {
    uVar4 = (undefined1)local_14;
    uVar3 = (uint)local_14 >> 0x18;
    local_14._1_2_ = SUB42(fVar5,1);
    uVar1 = local_14._1_2_ << 8;
    uVar2 = local_14._1_2_ >> 8;
    _auStack_18 = CONCAT17(uVar4,CONCAT25(uVar1 | uVar2,(uint5)uVar3 << 0x20));
  }
  return local_14;
}

Assistant:

float read_float(std::istream& _in, bool _swap)
{
  union u3 { float f; unsigned char c[4]; } fc;
  _in.read((char*)fc.c, 4);
  if (_swap) {
    std::swap(fc.c[0], fc.c[3]);
    std::swap(fc.c[1], fc.c[2]);
  }
  return fc.f;
}